

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O2

UniValue *
generateBlocks(UniValue *__return_storage_ptr__,ChainstateManager *chainman,Mining *miner,
              CScript *coinbase_script,int nGenerate,uint64_t nMaxTries)

{
  string str;
  UniValue val;
  bool bVar1;
  long in_FS_OFFSET;
  shared_ptr<const_CBlock> block_out;
  undefined8 uStack_158;
  _Head_base<0UL,_interfaces::BlockTemplate_*,_false> local_150;
  uint64_t nMaxTries_local;
  base_blob<256u> local_140 [32];
  UniValue local_120;
  CBlock local_c8;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  str._M_string_length = (size_type)coinbase_script;
  str._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  str.field_2._M_allocated_capacity =
       (size_type)block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  str.field_2._8_8_ =
       block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  nMaxTries_local = nMaxTries;
  UniValue::UniValue(__return_storage_ptr__,VARR,str);
  std::__cxx11::string::~string((string *)&local_58);
  do {
    if (nGenerate < 1) break;
    bVar1 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
    if (bVar1) break;
    local_c8.super_CBlockHeader.nVersion._0_1_ = 1;
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0xa0;
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\x0f';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = 0x90;
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\x01';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_c8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    (*miner->_vptr_Mining[6])(&local_150,miner,coinbase_script,&local_c8);
    inline_check_non_fatal<std::unique_ptr<interfaces::BlockTemplate,std::default_delete<interfaces::BlockTemplate>>&>
              ((unique_ptr<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>_>
                *)&local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mining.cpp"
               ,0xa5,"generateBlocks","block_template");
    block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (*(local_150._M_head_impl)->_vptr_BlockTemplate[3])(&local_c8);
    bVar1 = GenerateBlock(chainman,miner,&local_c8,&nMaxTries_local,&block_out,true);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_c8.vtx);
    if ((bVar1) &&
       (block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0)) {
      CBlockHeader::GetHash
                ((uint256 *)local_140,
                 &(block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_CBlockHeader);
      base_blob<256u>::GetHex_abi_cxx11_((string *)&local_c8,local_140);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8);
      val.val._M_dataplus._M_p = (pointer)coinbase_script;
      val._0_8_ = __return_storage_ptr__;
      val.val._M_string_length =
           (size_type)block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      val.val.field_2._M_allocated_capacity =
           (size_type)
           block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      val.val.field_2._8_8_ = uStack_158;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_150._M_head_impl;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)nMaxTries_local;
      val._56_32_ = local_140;
      UniValue::push_back(__return_storage_ptr__,val);
      nGenerate = nGenerate + -1;
      UniValue::~UniValue(&local_120);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&block_out.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (local_150._M_head_impl != (BlockTemplate *)0x0) {
      (*(local_150._M_head_impl)->_vptr_BlockTemplate[1])();
    }
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static UniValue generateBlocks(ChainstateManager& chainman, Mining& miner, const CScript& coinbase_script, int nGenerate, uint64_t nMaxTries)
{
    UniValue blockHashes(UniValue::VARR);
    while (nGenerate > 0 && !chainman.m_interrupt) {
        std::unique_ptr<BlockTemplate> block_template(miner.createNewBlock(coinbase_script));
        CHECK_NONFATAL(block_template);

        std::shared_ptr<const CBlock> block_out;
        if (!GenerateBlock(chainman, miner, block_template->getBlock(), nMaxTries, block_out, /*process_new_block=*/true)) {
            break;
        }

        if (block_out) {
            --nGenerate;
            blockHashes.push_back(block_out->GetHash().GetHex());
        }
    }
    return blockHashes;
}